

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# home.cpp
# Opt level: O2

string * fs_get_profile_dir_abi_cxx11_(void)

{
  char *__s;
  passwd *ppVar1;
  size_t sVar2;
  string *in_RDI;
  string_view in;
  string_view fname;
  error_code ec;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  ppVar1 = fs_getpwuid();
  if (ppVar1 == (passwd *)0x0) {
    fname._M_str = "fs_get_profile_dir";
    fname._M_len = 0x12;
    fs_print_error((string_view)(ZEXT816(0x1186dc) << 0x40),fname,&ec);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  else {
    __s = ppVar1->pw_dir;
    sVar2 = strlen(__s);
    in._M_str = __s;
    in._M_len = sVar2;
    fs_drop_slash_abi_cxx11_(in_RDI,in);
  }
  return in_RDI;
}

Assistant:

std::string fs_get_profile_dir()
{
  // has no trailing slash

  std::error_code ec;

#if defined(_WIN32)
  // https://learn.microsoft.com/en-us/windows/win32/api/userenv/nf-userenv-getuserprofiledirectorya
  std::string path(fs_get_max_path(), '\0');
  // works on MSYS2, MSVC, oneAPI
  HANDLE h = nullptr;
  auto N = static_cast<DWORD>(path.size());

  const bool ok = OpenProcessToken( GetCurrentProcess(), TOKEN_QUERY, &h) != 0 &&
    GetUserProfileDirectoryA(h, path.data(), &N);

  if(CloseHandle(h) && ok && N > 0) {
    path.resize(N - 1);
    return fs_drop_slash(path);
  }
#else
  if (auto pw = fs_getpwuid())
    return fs_drop_slash(pw->pw_dir);
#endif

  fs_print_error("", __func__, ec);
  return {};
}